

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O0

void run_kd_tree<std::array<float,784ul>,float>
               (vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *train,
               vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *test,
               string *fn_nns_gt,max_leaf_size_t tree_max_leaf_size,
               vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
               *nns)

{
  bool bVar1;
  byte bVar2;
  neighbor_type *pnVar3;
  ostream *poVar4;
  string *in_RDX;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *in_RSI;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_> *in_R8;
  size_t i;
  scoped_timer t1;
  kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  kd_tree;
  string *in_stack_ffffffffffffe628;
  scoped_timer *in_stack_ffffffffffffe630;
  array<float,_784UL> *x;
  undefined7 in_stack_ffffffffffffe640;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *__new_size;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *in_stack_ffffffffffffe650;
  allocator<char> *in_stack_ffffffffffffe660;
  neighbor_type *nn;
  neighbor_type *__n;
  char *in_stack_ffffffffffffe668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe670;
  format in_stack_ffffffffffffe687;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe688;
  path *in_stack_ffffffffffffe690;
  scoped_timer *in_stack_ffffffffffffe6a0;
  anon_class_16_2_5d62e1b5 *in_stack_ffffffffffffe6b8;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *in_stack_ffffffffffffe868;
  string *in_stack_ffffffffffffe870;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *in_stack_ffffffffffffe8a8;
  string *in_stack_ffffffffffffe8b0;
  
  __new_size = in_R8;
  pico_tree::std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>::size
            (in_RSI);
  pico_tree::std::
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::resize
            (in_stack_ffffffffffffe650,(size_type)__new_size);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe687);
  bVar1 = pico_tree::std::filesystem::exists((path *)in_stack_ffffffffffffe630);
  bVar2 = bVar1 ^ 0xff;
  pico_tree::std::filesystem::__cxx11::path::~path((path *)in_stack_ffffffffffffe630);
  if ((bVar2 & 1) == 0) {
    pico_tree::read_bin<pico_tree::neighbor<int,float>>
              (in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
    poVar4 = std::operator<<((ostream *)&std::cout,"kd_tree not created. Read ");
    poVar4 = std::operator<<(poVar4,in_RDX);
    poVar4 = std::operator<<(poVar4," instead.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Creating ");
    poVar4 = std::operator<<(poVar4,in_RDX);
    poVar4 = std::operator<<(poVar4," using the kd_tree. Be *very* patient.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    run_kd_tree<std::array<float,_784UL>,_float>::anon_class_16_2_5d62e1b5::operator()
              (in_stack_ffffffffffffe6b8);
    x = (array<float,_784UL> *)&stack0xffffffffffffe66f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe670,in_stack_ffffffffffffe668,in_stack_ffffffffffffe660);
    pico_tree::scoped_timer::scoped_timer(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffe670);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe66f);
    nn = (neighbor_type *)0x0;
    while( true ) {
      __n = nn;
      pnVar3 = (neighbor_type *)
               pico_tree::std::
               vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
               ::size(in_R8);
      if (pnVar3 <= nn) break;
      pico_tree::std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>::
      operator[](in_RSI,(size_type)__n);
      pico_tree::std::
      vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::
      operator[](in_R8,(size_type)__n);
      pico_tree::
      kd_tree<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
      ::search_nn<std::array<float,784ul>>
                ((kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
                  *)CONCAT17(bVar2,in_stack_ffffffffffffe640),x,nn);
      nn = (neighbor_type *)((long)&__n->index + 1);
    }
    pico_tree::scoped_timer::~scoped_timer(in_stack_ffffffffffffe6a0);
    pico_tree::write_bin<pico_tree::neighbor<int,float>>
              (in_stack_ffffffffffffe870,in_stack_ffffffffffffe868);
    pico_tree::
    kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
    ::~kd_tree((kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
                *)0x1044d0);
  }
  return;
}

Assistant:

void run_kd_tree(
    std::vector<Vector_> const& train,
    std::vector<Vector_> const& test,
    std::string const& fn_nns_gt,
    pico_tree::max_leaf_size_t tree_max_leaf_size,
    std::vector<pico_tree::neighbor<int, Scalar_>>& nns) {
  using space = std::reference_wrapper<std::vector<Vector_> const>;

  nns.resize(test.size());

  if (!std::filesystem::exists(fn_nns_gt)) {
    std::cout << "Creating " << fn_nns_gt
              << " using the kd_tree. Be *very* patient." << std::endl;

    auto kd_tree = [&train, &tree_max_leaf_size]() {
      pico_tree::scoped_timer t0("kd_tree build");
      return pico_tree::kd_tree<space>(train, tree_max_leaf_size);
    }();

    {
      pico_tree::scoped_timer t1("kd_tree query");
      for (std::size_t i = 0; i < nns.size(); ++i) {
        kd_tree.search_nn(test[i], nns[i]);
      }
    }

    pico_tree::write_bin(fn_nns_gt, nns);
  } else {
    pico_tree::read_bin(fn_nns_gt, nns);
    std::cout << "kd_tree not created. Read " << fn_nns_gt << " instead."
              << std::endl;
  }
}